

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O3

void __thiscall LiteScript::Namer::LoadIDs(Namer *this,istream *stream)

{
  Memory *pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Object *pOVar8;
  Nullable<LiteScript::Variable> local_68;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *local_48;
  Variable local_40;
  
  pOVar8 = Variable::operator->(&this->global);
  pMVar1 = pOVar8->memory;
  uVar2 = std::istream::get();
  uVar3 = std::istream::get();
  uVar4 = std::istream::get();
  iVar5 = std::istream::get();
  Memory::GetVariable(&local_68,pMVar1,
                      (uVar4 & 0xff) << 0x10 | iVar5 << 0x18 | (uVar3 & 0xff) << 8 | uVar2 & 0xff);
  Nullable<LiteScript::Variable>::operator=(&this->current,&local_68);
  if (local_68.is_null == false) {
    Variable::~Variable((Variable *)&local_68);
  }
  uVar2 = std::istream::get();
  uVar3 = std::istream::get();
  uVar4 = std::istream::get();
  iVar5 = std::istream::get();
  uVar2 = iVar5 << 0x18 | (uVar4 & 0xff) << 0x10 | (uVar3 & 0xff) << 8 | uVar2 & 0xff;
  if (uVar2 != 0) {
    local_48 = &this->heap;
    uVar3 = 0;
    do {
      pOVar8 = Variable::operator->(&this->global);
      pMVar1 = pOVar8->memory;
      uVar4 = std::istream::get();
      uVar6 = std::istream::get();
      uVar7 = std::istream::get();
      iVar5 = std::istream::get();
      Memory::GetVariable(&local_68,pMVar1,
                          (uVar7 & 0xff) << 0x10 | iVar5 << 0x18 |
                          (uVar6 & 0xff) << 8 | uVar4 & 0xff);
      Variable::Variable(&local_40,(Variable *)&local_68);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>(local_48,&local_40);
      Variable::~Variable(&local_40);
      if (local_68.is_null == false) {
        Variable::~Variable((Variable *)&local_68);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  return;
}

Assistant:

void LiteScript::Namer::LoadIDs(std::istream &stream) {
    this->current = this->global->memory.GetVariable(IStreamer::Read<unsigned int>(stream));
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        this->heap.push_back(this->global->memory.GetVariable(IStreamer::Read<unsigned int>(stream)));
}